

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::Attribute_Access<int,_chaiscript::File_Position>::do_call
          (Attribute_Access<int,_chaiscript::File_Position> *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  Type_Conversions *bv;
  Type_Conversions_State *in_RCX;
  Boxed_Value BVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  bv = (t_conversions->m_conversions)._M_data;
  if (((((element_type *)(bv->m_mutex).super_mutex.super___mutex_base._M_mutex.__align)->m_type_info
       ).m_flags & 1) == 0) {
    boxed_cast<chaiscript::File_Position*>((Boxed_Value *)bv,in_RCX);
    BVar2 = detail::Handle_Return<int_&>::handle((int *)this);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    boxed_cast<chaiscript::File_Position_const*>((Boxed_Value *)bv,in_RCX);
    BVar2 = detail::Handle_Return<int_&>::handle((int *)this);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          const Boxed_Value &bv = params[0];
          if (bv.is_const())
          {
            const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
            return detail::Handle_Return<const typename std::add_lvalue_reference<T>::type>::handle(o->*m_attr);
          } else {
            Class *o = boxed_cast<Class *>(bv, &t_conversions);
            return detail::Handle_Return<typename std::add_lvalue_reference<T>::type>::handle(o->*m_attr);
          }
        }